

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_CheckIfInTargetLOS
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  bool bVar1;
  uint uVar2;
  VMValue *pVVar3;
  bool bVar4;
  double dVar5;
  bool local_b8;
  bool local_b7;
  int u_6;
  int u_5;
  int u_4;
  undefined1 local_a0 [16];
  DAngle an;
  int u_3;
  bool doCheckSight;
  int u_2;
  double distance;
  int u_1;
  int u;
  AActor *local_68;
  AActor *target;
  double dist_close;
  double dist_max;
  int flags;
  DAngle fov;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x111e,
                  "int AF_AActor_CheckIfInTargetLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar4 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar4 = true, (param->field_0).field_1.atag != 1)) {
    bVar4 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar4) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x111e,
                  "int AF_AActor_CheckIfInTargetLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  fov.Degrees = *(double *)&param->field_0;
  local_b7 = true;
  if ((DObject *)fov.Degrees != (DObject *)0x0) {
    local_b7 = DObject::IsKindOf((DObject *)fov.Degrees,AActor::RegistrationInfo.MyClass);
  }
  if (local_b7 == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x111e,
                  "int AF_AActor_CheckIfInTargetLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  TAngle<double>::TAngle((TAngle<double> *)&stack0xffffffffffffffb8);
  if (numparam < 2) {
    pVVar3 = TArray<VMValue,_VMValue>::operator[](defaultparam,1);
    if ((pVVar3->field_0).field_3.Type != '\x01') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x111f,
                    "int AF_AActor_CheckIfInTargetLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pVVar3 = TArray<VMValue,_VMValue>::operator[](defaultparam,1);
    TAngle<double>::operator=((TAngle<double> *)&stack0xffffffffffffffb8,(pVVar3->field_0).f);
  }
  else {
    if (param[1].field_0.field_3.Type != '\x01') {
      __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x111f,
                    "int AF_AActor_CheckIfInTargetLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    TAngle<double>::operator=((TAngle<double> *)&stack0xffffffffffffffb8,param[1].field_0.f);
  }
  if (numparam < 3) {
    pVVar3 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
    if ((pVVar3->field_0).field_3.Type != '\0') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1120,
                    "int AF_AActor_CheckIfInTargetLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pVVar3 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
    dist_max._4_4_ = (pVVar3->field_0).i;
  }
  else {
    if (param[2].field_0.field_3.Type != '\0') {
      __assert_fail("(param[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1120,
                    "int AF_AActor_CheckIfInTargetLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    dist_max._4_4_ = param[2].field_0.i;
  }
  if (numparam < 4) {
    pVVar3 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
    if ((pVVar3->field_0).field_3.Type != '\x01') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1121,
                    "int AF_AActor_CheckIfInTargetLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pVVar3 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
    dist_close = (pVVar3->field_0).f;
  }
  else {
    if (param[3].field_0.field_3.Type != '\x01') {
      __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1121,
                    "int AF_AActor_CheckIfInTargetLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    dist_close = param[3].field_0.f;
  }
  if (numparam < 5) {
    pVVar3 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
    if ((pVVar3->field_0).field_3.Type != '\x01') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1122,
                    "int AF_AActor_CheckIfInTargetLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pVVar3 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
    target = (AActor *)(pVVar3->field_0).field_1.a;
  }
  else {
    if (param[4].field_0.field_3.Type != '\x01') {
      __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1122,
                    "int AF_AActor_CheckIfInTargetLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    target = (AActor *)param[4].field_0.field_1.a;
  }
  if ((dist_max._4_4_ & 0x40) == 0) {
    TFlags<ActorFlag,_unsigned_int>::operator&
              ((TFlags<ActorFlag,_unsigned_int> *)&u,
               SUB84(fov.Degrees,0) +
               (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE));
    uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&u);
    local_b8 = uVar2 == 0 || (dist_max._4_4_ & 1) == 0;
    if (local_b8) {
      local_68 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)((long)fov.Degrees + 0x208));
    }
    else {
      TFlags<ActorFlag2,_unsigned_int>::operator&
                ((TFlags<ActorFlag2,_unsigned_int> *)&u_1,
                 SUB84(fov.Degrees,0) + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
      uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&u_1);
      if (uVar2 == 0) {
        local_68 = (AActor *)0x0;
      }
      else {
        local_68 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)((long)fov.Degrees + 0x278));
      }
    }
  }
  else {
    local_68 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)((long)fov.Degrees + 0x280));
  }
  if (local_68 == (AActor *)0x0) {
    if (numret < 1) {
      param_local._4_4_ = 0;
    }
    else {
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x1138,
                      "int AF_AActor_CheckIfInTargetLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      VMReturn::SetInt(ret,0);
      param_local._4_4_ = 1;
    }
  }
  else if (((dist_max._4_4_ & 0x20) == 0) || (0 < local_68->health)) {
    dVar5 = AActor::Distance3D(fov.Degrees,local_68,false);
    if (((dist_close == 0.0) && (!NAN(dist_close))) || (dVar5 <= dist_close)) {
      bVar4 = (dist_max._4_4_ & 2) == 0;
      if ((((double)target != 0.0) || (NAN((double)target))) && (dVar5 < (double)target)) {
        if ((dist_max._4_4_ & 0x10) != 0) {
          an.Degrees._4_4_ = 0;
          if (numret < 1) {
            return 0;
          }
          if (ret != (VMReturn *)0x0) {
            VMReturn::SetInt(ret,0);
            return 1;
          }
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x114d,
                        "int AF_AActor_CheckIfInTargetLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        if ((dist_max._4_4_ & 4) != 0) {
          TAngle<double>::operator=((TAngle<double> *)&stack0xffffffffffffffb8,0.0);
        }
        bVar4 = (dist_max._4_4_ & 8) == 0 && bVar4;
      }
      bVar1 = TAngle<double>::operator>((TAngle<double> *)&stack0xffffffffffffffb8,0.0);
      if ((bVar1) &&
         (bVar1 = TAngle<double>::operator<((TAngle<double> *)&stack0xffffffffffffffb8,360.0), bVar1
         )) {
        AActor::AngleTo((AActor *)local_a0,local_68,SUB81(fov.Degrees,0));
        absangle<double>((TAngle<double> *)(local_a0 + 8),(TAngle<double> *)local_a0);
        TAngle<double>::operator/((TAngle<double> *)&u_5,2.0);
        bVar1 = TAngle<double>::operator>((TAngle<double> *)(local_a0 + 8),(TAngle<double> *)&u_5);
        if (bVar1) {
          if (numret < 1) {
            return 0;
          }
          if (ret != (VMReturn *)0x0) {
            VMReturn::SetInt(ret,0);
            return 1;
          }
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x115c,
                        "int AF_AActor_CheckIfInTargetLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
      }
      if ((!bVar4) || (bVar4 = P_CheckSight(local_68,(AActor *)fov.Degrees,1), bVar4)) {
        if (numret < 1) {
          param_local._4_4_ = 0;
        }
        else {
          if (ret == (VMReturn *)0x0) {
            __assert_fail("ret != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x1163,
                          "int AF_AActor_CheckIfInTargetLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          VMReturn::SetInt(ret,1);
          param_local._4_4_ = 1;
        }
      }
      else if (numret < 1) {
        param_local._4_4_ = 0;
      }
      else {
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1161,
                        "int AF_AActor_CheckIfInTargetLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        VMReturn::SetInt(ret,0);
        param_local._4_4_ = 1;
      }
    }
    else if (numret < 1) {
      param_local._4_4_ = 0;
    }
    else {
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x1144,
                      "int AF_AActor_CheckIfInTargetLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      VMReturn::SetInt(ret,0);
      param_local._4_4_ = 1;
    }
  }
  else if (numret < 1) {
    param_local._4_4_ = 0;
  }
  else {
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x113d,
                    "int AF_AActor_CheckIfInTargetLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    VMReturn::SetInt(ret,0);
    param_local._4_4_ = 1;
  }
  return param_local._4_4_;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, CheckIfInTargetLOS)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_ANGLE_DEF	(fov)		
	PARAM_INT_DEF	(flags)		
	PARAM_FLOAT_DEF	(dist_max)	
	PARAM_FLOAT_DEF	(dist_close)

	AActor *target;

	if (flags & JLOSF_CHECKMASTER)
	{
		target = self->master;
	}
	else if (self->flags & MF_MISSILE && (flags & JLOSF_PROJECTILE))
	{
		if (self->flags2 & MF2_SEEKERMISSILE)
			target = self->tracer;
		else
			target = NULL;
	}
	else
	{
		target = self->target;
	}

	if (target == NULL)
	{ // [KS] Let's not call P_CheckSight unnecessarily in this case.
		ACTION_RETURN_BOOL(false);
	}

	if ((flags & JLOSF_DEADNOJUMP) && (target->health <= 0))
	{
		ACTION_RETURN_BOOL(false);
	}

	double distance = self->Distance3D(target);

	if (dist_max && (distance > dist_max))
	{
		ACTION_RETURN_BOOL(false);
	}

	bool doCheckSight = !(flags & JLOSF_NOSIGHT);

	if (dist_close && (distance < dist_close))
	{
		if (flags & JLOSF_CLOSENOJUMP)
		{
			ACTION_RETURN_BOOL(false);
		}
		if (flags & JLOSF_CLOSENOFOV)
			fov = 0.;

		if (flags & JLOSF_CLOSENOSIGHT)
			doCheckSight = false;
	}

	if (fov > 0 && (fov < 360.))
	{
		DAngle an = absangle(target->AngleTo(self), target->Angles.Yaw);

		if (an > (fov / 2))
		{
			ACTION_RETURN_BOOL(false); // [KS] Outside of FOV - return
		}
	}
	if (doCheckSight && !P_CheckSight (target, self, SF_IGNOREVISIBILITY))
	{
		ACTION_RETURN_BOOL(false);
	}
	ACTION_RETURN_BOOL(true);
}